

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O1

bool __thiscall
draco::KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  float range;
  byte bVar1;
  char cVar2;
  DataType dt;
  uint uVar3;
  long lVar4;
  PointAttribute *pPVar5;
  pointer pIVar6;
  pointer piVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint32_t dimension;
  uint uVar17;
  uint uVar18;
  byte unaff_R15B;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  vector<float,_std::allocator<float>_> min_value;
  AttributeQuantizationTransform transform;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  local_490;
  PointAttributeVectorOutputIterator<unsigned_int> local_478;
  undefined1 local_430 [16];
  pointer local_420;
  int iStack_418;
  uint32_t uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  float fStack_408;
  
  if (0x202 < in_buffer->bitstream_version_) {
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar17 = 0;
        iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[6])(this), (int)uVar17 < iVar10;
        uVar17 = uVar17 + 1) {
      iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[5])(this,(ulong)uVar17);
      iVar11 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      lVar15 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar11) + 8) + 0x10) +
                        (long)iVar10 * 8);
      if (*(int *)(lVar15 + 0x1c) == 9) {
        bVar1 = *(byte *)(lVar15 + 0x18);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)&local_478,(ulong)bVar1);
        uVar16 = (ulong)((uint)bVar1 * 4);
        if ((long)(in_buffer->pos_ + uVar16) <= in_buffer->data_size_) {
          memcpy(local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start,in_buffer->data_ + in_buffer->pos_,uVar16
                );
          lVar4 = in_buffer->data_size_;
          lVar13 = in_buffer->pos_;
          lVar15 = lVar13 + uVar16;
          in_buffer->pos_ = lVar15;
          lVar13 = lVar13 + uVar16 + 4;
          if (lVar13 <= lVar4) {
            range = *(float *)(in_buffer->data_ + lVar15);
            in_buffer->pos_ = lVar13;
            lVar15 = in_buffer->pos_ + 1;
            if (lVar15 <= lVar4) {
              unaff_R15B = in_buffer->data_[in_buffer->pos_];
              in_buffer->pos_ = lVar15;
            }
            bVar8 = false;
            local_490.
            super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_478.memory_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            local_490.
            super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_478.memory_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            if ((lVar4 < lVar15) || (0x1f < unaff_R15B)) goto joined_r0x00156aa6;
            local_430._0_8_ = &PTR__AttributeQuantizationTransform_001e2aa0;
            local_430._8_4_ = 0xffffffff;
            uStack_410 = 0;
            uStack_40c = 0;
            fStack_408 = 0.0;
            local_420 = (pointer)0x0;
            iStack_418 = 0;
            uStack_414 = 0;
            bVar8 = AttributeQuantizationTransform::SetParameters
                              ((AttributeQuantizationTransform *)local_430,(uint)unaff_R15B,
                               (float *)local_478.memory_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,(uint)bVar1,range)
            ;
            if ((bVar8) &&
               (bVar8 = AttributeTransform::TransferToAttribute
                                  ((AttributeTransform *)local_430,
                                   (PointAttribute *)
                                   (this->quantized_portable_attributes_).
                                   super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(int)((ulong)((long)(this->attribute_quantization_transforms_).
                                                                                                                
                                                  super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(this->attribute_quantization_transforms_).
                                                                                                              
                                                  super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                    -0x55555555]._M_t.
                                   super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                   ._M_t), bVar8)) {
              std::
              vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
              ::push_back(&this->attribute_quantization_transforms_,(value_type *)local_430);
              local_430._0_8_ = &PTR__AttributeQuantizationTransform_001e2aa0;
              if (local_420 != (pointer)0x0) {
                operator_delete(local_420,CONCAT44(uStack_40c,uStack_410) - (long)local_420);
              }
              if (bVar8) goto LAB_00156809;
            }
            else {
              local_430._0_8_ = &PTR__AttributeQuantizationTransform_001e2aa0;
              if (local_420 != (pointer)0x0) {
                operator_delete(local_420,CONCAT44(uStack_40c,uStack_410) - (long)local_420);
              }
            }
          }
        }
        bVar8 = false;
        local_490.
        super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_478.memory_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_490.
        super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_478.memory_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x00156aa6;
      }
LAB_00156809:
    }
    bVar8 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_490.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_478.memory_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_490.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_478.memory_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    if (!bVar8) {
      uVar16 = 0;
      do {
        bVar9 = anon_unknown_46::DecodeVarintUnsigned<unsigned_int>(1,(uint *)local_430,in_buffer);
        local_490.
        super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_478.memory_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_490.
        super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_478.memory_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        if (!bVar9) break;
        piVar7 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7[uVar16] = -(local_430._0_4_ & 1) ^ (uint)local_430._0_4_ >> 1;
        uVar16 = uVar16 + 1;
        uVar14 = (long)(this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
        bVar8 = uVar14 <= uVar16;
      } while (uVar16 < uVar14);
    }
    goto joined_r0x00156aa6;
  }
  uVar17 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[6])(this);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&local_490,(ulong)uVar17,(allocator_type *)local_430);
  if (uVar17 == 0) {
    dimension = 0;
  }
  else {
    lVar15 = 0x10;
    uVar16 = 0;
    dimension = 0;
    do {
      iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[5])(this,uVar16 & 0xffffffff);
      iVar11 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      lVar4 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar11) + 8) + 0x10) +
                       (long)iVar10 * 8);
      dt = *(DataType *)(lVar4 + 0x1c);
      iVar12 = DataTypeLength(dt);
      if (4 < iVar12) goto LAB_00156a9c;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      bVar1 = *(byte *)(lVar4 + 0x18);
      *(long *)((long)&((local_490.
                         super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       ).
                       super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                       super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
                       super__Tuple_impl<4UL,_unsigned_int>.
                       super__Head_base<4UL,_unsigned_int,_false>._M_head_impl + lVar15) = lVar4;
      *(uint32_t *)
       ((long)local_490.
              super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15 + -4) = dimension;
      *(DataType *)
       ((long)&local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + lVar15) = dt;
      *(int32_t *)
       ((long)&local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
               super__Head_base<1UL,_unsigned_int,_false>._M_head_impl + lVar15) = iVar12;
      *(uint *)((long)&local_490.
                       super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .
                       super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                       super__Head_base<2UL,_draco::DataType,_false>._M_head_impl + lVar15) =
           (uint)bVar1;
      dimension = dimension + bVar1;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x18;
    } while (uVar17 != uVar16);
  }
  iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[5])(this,0);
  iVar11 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[7])(this);
  pPVar5 = *(PointAttribute **)
            (*(long *)(*(long *)(CONCAT44(extraout_var_01,iVar11) + 8) + 0x10) + (long)iVar10 * 8);
  pPVar5->identity_mapping_ = true;
  pIVar6 = (pPVar5->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar5->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
    (pPVar5->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  }
  lVar4 = in_buffer->data_size_;
  lVar15 = in_buffer->pos_ + 1;
  if (lVar4 < lVar15) goto LAB_00156a9c;
  cVar2 = in_buffer->data_[in_buffer->pos_];
  in_buffer->pos_ = lVar15;
  if (cVar2 == '\x01') {
    lVar15 = in_buffer->pos_ + 1;
    if (lVar4 < lVar15) goto LAB_00156a9c;
    bVar1 = in_buffer->data_[in_buffer->pos_];
    in_buffer->pos_ = lVar15;
    if (6 < bVar1) {
      bVar8 = false;
      printf("KdTreeAttributesDecoder: compression level %i not supported.\n",(ulong)(uint)bVar1);
      goto joined_r0x00156aa6;
    }
    lVar15 = in_buffer->pos_ + 4;
    if (lVar4 < lVar15) goto LAB_00156a9c;
    uVar3 = *(uint *)(in_buffer->data_ + in_buffer->pos_);
    in_buffer->pos_ = lVar15;
    if (uVar17 != 0) {
      uVar16 = 0;
      do {
        iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[5])(this,uVar16);
        iVar11 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[7])(this);
        pPVar5 = *(PointAttribute **)
                  (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar11) + 8) + 0x10) +
                  (long)iVar10 * 8);
        PointAttribute::Reset(pPVar5,(ulong)uVar3);
        pPVar5->identity_mapping_ = true;
        pIVar6 = (pPVar5->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pPVar5->indices_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
          (pPVar5->indices_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
        }
        uVar18 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar18;
      } while (uVar17 != uVar18);
    }
    PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
              (&local_478,&local_490);
    switch((uint)bVar1) {
    case 0:
      DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<0>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430);
      break;
    case 1:
      DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<1>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430);
      break;
    case 2:
      DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<2>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430);
      break;
    case 3:
      DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<3>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430);
      break;
    case 4:
      DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<4>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430);
      break;
    case 5:
      DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<5>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430);
      break;
    case 6:
      DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430,dimension);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<6>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430,in_buffer,&local_478,
                         0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430);
      break;
    default:
      goto switchD_00156b92_default;
    }
    if (bVar8 != false) {
      PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
                (&local_478);
LAB_00156d03:
      bVar8 = true;
      goto joined_r0x00156aa6;
    }
switchD_00156b92_default:
    PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
              (&local_478);
  }
  else {
    if (((cVar2 != '\0') ||
        ((long)local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0x18)) ||
       ((uint)((local_490.
                super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
              ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<4UL,_unsigned_int>.super__Head_base<4UL,_unsigned_int,_false> != 3))
    goto LAB_00156a9c;
    lVar13 = in_buffer->pos_;
    lVar15 = lVar13 + 1;
    bVar8 = false;
    if (lVar4 < lVar15) goto joined_r0x00156aa6;
    in_buffer->pos_ = lVar15;
    lVar13 = lVar13 + 5;
    if (lVar13 <= lVar4) {
      uVar17 = *(uint *)(in_buffer->data_ + lVar15);
      in_buffer->pos_ = lVar13;
      PointAttribute::Reset(pPVar5,(ulong)uVar17);
      FloatPointsTreeDecoder::FloatPointsTreeDecoder((FloatPointsTreeDecoder *)&local_478);
      local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(uVar17,local_478.memory_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
                ((PointAttributeVectorOutputIterator<float> *)local_430,&local_490);
      bVar8 = FloatPointsTreeDecoder::
              DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
                        ((FloatPointsTreeDecoder *)&local_478,in_buffer,
                         (PointAttributeVectorOutputIterator<float> *)local_430);
      PointAttributeVectorOutputIterator<float>::~PointAttributeVectorOutputIterator
                ((PointAttributeVectorOutputIterator<float> *)local_430);
      if (!bVar8) goto LAB_00156a9c;
      goto LAB_00156d03;
    }
  }
LAB_00156a9c:
  bVar8 = false;
joined_r0x00156aa6:
  if (local_490.
      super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.
                    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_490.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_490.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 3)) {
    // Decode quantization data for each attribute that need it.
    // TODO(ostava): This should be moved to AttributeQuantizationTransform.
    std::vector<float> min_value;
    for (int i = 0; i < GetNumAttributes(); ++i) {
      const int att_id = GetAttributeId(i);
      const PointAttribute *const att =
          GetDecoder()->point_cloud()->attribute(att_id);
      if (att->data_type() == DT_FLOAT32) {
        const int num_components = att->num_components();
        min_value.resize(num_components);
        if (!in_buffer->Decode(&min_value[0], sizeof(float) * num_components)) {
          return false;
        }
        float max_value_dif;
        if (!in_buffer->Decode(&max_value_dif)) {
          return false;
        }
        uint8_t quantization_bits;
        if (!in_buffer->Decode(&quantization_bits) || quantization_bits > 31) {
          return false;
        }
        AttributeQuantizationTransform transform;
        if (!transform.SetParameters(quantization_bits, min_value.data(),
                                     num_components, max_value_dif)) {
          return false;
        }
        const int num_transforms =
            static_cast<int>(attribute_quantization_transforms_.size());
        if (!transform.TransferToAttribute(
                quantized_portable_attributes_[num_transforms].get())) {
          return false;
        }
        attribute_quantization_transforms_.push_back(transform);
      }
    }

    // Decode transform data for signed integer attributes.
    for (int i = 0; i < min_signed_values_.size(); ++i) {
      int32_t val;
      if (!DecodeVarint(&val, in_buffer)) {
        return false;
      }
      min_signed_values_[i] = val;
    }
    return true;
  }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  // Handle old bitstream
  // Figure out the total dimensionality of the point cloud
  const uint32_t attribute_count = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(attribute_count);
  for (auto attribute_index = 0;
       static_cast<uint32_t>(attribute_index) < attribute_count;
       attribute_index += 1)  // increment the dimensionality as needed...
  {
    const int att_id = GetAttributeId(attribute_index);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    const DataType data_type = att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = att->num_components();
    if (data_size > 4) {
      return false;
    }

    atts[attribute_index] = std::make_tuple(
        att, total_dimensionality, data_type, data_size, num_components);
    // everything is treated as 32bit in the encoder.
    total_dimensionality += num_components;
  }

  const int att_id = GetAttributeId(0);
  PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
  att->SetIdentityMapping();
  // Decode method
  uint8_t method;
  if (!in_buffer->Decode(&method)) {
    return false;
  }
  if (method == KdTreeAttributesEncodingMethod::kKdTreeQuantizationEncoding) {
    // This method only supports one attribute with exactly three components.
    if (atts.size() != 1 || std::get<4>(atts[0]) != 3) {
      return false;
    }
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    uint32_t num_points = 0;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }
    att->Reset(num_points);
    FloatPointsTreeDecoder decoder;
    decoder.set_num_points_from_header(num_points);
    PointAttributeVectorOutputIterator<float> out_it(atts);
    if (!decoder.DecodePointCloud(in_buffer, out_it)) {
      return false;
    }
  } else if (method == KdTreeAttributesEncodingMethod::kKdTreeIntegerEncoding) {
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    if (6 < compression_level) {
      DRACO_LOGE(
          "KdTreeAttributesDecoder: compression level %i not supported.\n",
          compression_level);
      return false;
    }

    uint32_t num_points;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }

    for (auto attribute_index = 0;
         static_cast<uint32_t>(attribute_index) < attribute_count;
         attribute_index += 1) {
      const int att_id = GetAttributeId(attribute_index);
      PointAttribute *const attr =
          GetDecoder()->point_cloud()->attribute(att_id);
      attr->Reset(num_points);
      attr->SetIdentityMapping();
    }

    PointAttributeVectorOutputIterator<uint32_t> out_it(atts);

    switch (compression_level) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      default:
        return false;
    }
  } else {
    // Invalid method.
    return false;
  }
  return true;
#else
  return false;
#endif
}